

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  char cVar1;
  EnumType lIndex;
  ushort local_32;
  Logger *local_30;
  ushort *local_28;
  code *local_20;
  code *local_18;
  
  std::
  _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::_Select1st<std::pair<const_el::Level,_unsigned_int>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::clear(&(this->m_unflushedCount)._M_t);
  local_28 = &local_32;
  local_32 = 2;
  local_18 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3581:44)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3581:44)>
             ::_M_manager;
  local_30 = this;
  do {
    cVar1 = (*local_18)(&local_30);
    if ((cVar1 != '\0') || (local_32 = local_32 * 2, 0x80 < local_32)) goto LAB_00118dc6;
  } while (local_20 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_00118dc6:
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  return;
}

Assistant:

void initUnflushedCount(void) {
        m_unflushedCount.clear();
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
            return false;
        });
    }